

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TagAlias::~TagAlias(TagAlias *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->lineInfo).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineInfo).file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->tag)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tag).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TagAlias( std::string _tag, SourceLineInfo _lineInfo ) : tag( _tag ), lineInfo( _lineInfo ) {}